

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Job.cpp
# Opt level: O0

void __thiscall xmrig::Job::move(Job *this,Job *other)

{
  String *in_RSI;
  String *in_RDI;
  
  in_RDI[1].m_data = in_RSI[1].m_data;
  String::operator=(in_RSI,in_RDI);
  String::operator=(in_RSI,in_RDI);
  *(int *)&((Buffer *)in_RDI)[5].m_size = (int)((Buffer *)in_RSI)[5].m_size;
  ((Buffer *)in_RDI)[6].m_data = ((Buffer *)in_RSI)[6].m_data;
  ((Buffer *)in_RDI)[6].m_size = ((Buffer *)in_RSI)[6].m_size;
  ((Buffer *)in_RDI)[7].m_data = ((Buffer *)in_RSI)[7].m_data;
  *(char *)&((Buffer *)in_RDI)[0xf].m_size = (char)((Buffer *)in_RSI)[0xf].m_size;
  Buffer::operator=((Buffer *)in_RSI,(Buffer *)in_RDI);
  String::operator=(in_RSI,in_RDI);
  String::operator=(in_RSI,in_RDI);
  in_RDI[0x10].m_data = in_RSI[0x10].m_data;
  memcpy(&in_RDI[7].m_size,&in_RSI[7].m_size,0x80);
  in_RSI[1].m_data = (char *)0x0;
  in_RSI[6].m_data = (char *)0x0;
  return;
}

Assistant:

void xmrig::Job::move(Job &&other)
{
    m_size       = other.m_size;
    m_clientId   = std::move(other.m_clientId);
    m_id         = std::move(other.m_id);
    m_backend    = other.m_backend;
    m_diff       = other.m_diff;
    m_height     = other.m_height;
    m_target     = other.m_target;
    m_index      = other.m_index;
    m_seed       = std::move(other.m_seed);
    m_extraNonce = std::move(other.m_extraNonce);
    m_poolWallet = std::move(other.m_poolWallet);
    m_extraIters = std::move(other.m_extraIters);

    memcpy(m_blob, other.m_blob, sizeof(m_blob));

    other.m_size        = 0;
    other.m_diff        = 0;
}